

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_MockUnexpectedOutputParameterFailure_Test::testBody
          (TEST_MockFailureTest_MockUnexpectedOutputParameterFailure_Test *this)

{
  size_t *this_00;
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  undefined1 local_160 [40];
  MockUnexpectedOutputParameterFailure failure;
  undefined1 local_c8 [8];
  MockNamedValue actualParameter;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  undefined1 local_18 [4];
  undefined1 local_14 [4];
  int out2;
  int out1;
  TEST_MockFailureTest_MockUnexpectedOutputParameterFailure_Test *this_local;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  _out2 = this;
  SimpleString::SimpleString(&local_28,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_28);
  SimpleString::SimpleString(local_48,"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar2),local_48,local_14,4);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString(&local_58,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_58);
  SimpleString::SimpleString(&local_68,"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar2),&local_68,local_18,4);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)&actualParameter.copier_,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&actualParameter.copier_);
  SimpleString::~SimpleString((SimpleString *)&actualParameter.copier_);
  TEST_GROUP_CppUTestGroupMockFailureTest::addThreeCallsToList
            (&this->super_TEST_GROUP_CppUTestGroupMockFailureTest);
  this_00 = &failure.super_MockFailure.super_TestFailure.message_.bufferSize_;
  SimpleString::SimpleString((SimpleString *)this_00,"bar");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_c8,(SimpleString *)this_00);
  SimpleString::~SimpleString
            ((SimpleString *)&failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  MockNamedValue::setValue((MockNamedValue *)local_c8,(void *)0x123);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)(local_160 + 0x10),"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)(local_160 + 0x20),pUVar3,
             (SimpleString *)(local_160 + 0x10),(MockNamedValue *)local_c8,
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString((SimpleString *)(local_160 + 0x10));
  pUVar3 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_160);
  pcVar4 = SimpleString::asCharString((SimpleString *)local_160);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,
             "Mock Failure: Unexpected output parameter name to function \"foo\": bar\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\t<none>\n\tACTUAL unexpected output parameter passed to function: foo\n\t\tvoid* bar"
             ,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0xc6,pTVar5);
  SimpleString::~SimpleString((SimpleString *)local_160);
  MockUnexpectedOutputParameterFailure::~MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)(local_160 + 0x20));
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_c8);
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedOutputParameterFailure)
{
    int out1;
    int out2;
    call1->withName("foo").withOutputParameterReturning("boo", &out1, sizeof(out1));
    call2->withName("foo").withOutputParameterReturning("boo", &out2, sizeof(out2));
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue((void *)0x123);

    MockUnexpectedOutputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected output parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected output parameter passed to function: foo\n"
                 "\t\tvoid* bar", failure.getMessage().asCharString());
}